

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O1

void __thiscall
cmIncludeDirectoryCommand::NormalizeInclude(cmIncludeDirectoryCommand *this,string *inc)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  string tmp;
  allocator local_41;
  long *local_40 [2];
  long local_30 [2];
  
  uVar2 = std::__cxx11::string::find_first_not_of((char *)inc,0x5bf8c6,0);
  lVar3 = std::__cxx11::string::find_last_not_of((char *)inc,0x5bf8c6,0xffffffffffffffff);
  if (lVar3 == -1 || uVar2 == 0xffffffffffffffff) {
    std::__cxx11::string::_M_replace((ulong)inc,0,(char *)inc->_M_string_length,0x5fa2a3);
    return;
  }
  std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar2);
  bVar1 = cmSystemTools::IsOff((inc->_M_dataplus)._M_p);
  if (!bVar1) {
    cmsys::SystemTools::ConvertToUnixSlashes(inc);
    bVar1 = cmsys::SystemTools::FileIsFullPath((inc->_M_dataplus)._M_p);
    if ((!bVar1) && ((pcVar4 = (inc->_M_dataplus)._M_p, *pcVar4 != '$' || (pcVar4[1] != '<')))) {
      pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)local_40,pcVar4,&local_41);
      std::__cxx11::string::append((char *)local_40);
      std::__cxx11::string::_M_append((char *)local_40,(ulong)(inc->_M_dataplus)._M_p);
      std::__cxx11::string::_M_assign((string *)inc);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void cmIncludeDirectoryCommand::NormalizeInclude(std::string &inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b!=inc.npos) && (e!=inc.npos))
    {
    inc.assign(inc, b, 1+e-b);   // copy the remaining substring
    }
  else
    {
    inc = "";
    return;
    }

  if (!cmSystemTools::IsOff(inc.c_str()))
    {
    cmSystemTools::ConvertToUnixSlashes(inc);

    if(!cmSystemTools::FileIsFullPath(inc.c_str()))
      {
      if(!StartsWithGeneratorExpression(inc))
        {
        std::string tmp = this->Makefile->GetCurrentSourceDirectory();
        tmp += "/";
        tmp += inc;
        inc = tmp;
        }
      }
    }
}